

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::PastFunc::PastFunc(PastFunc *this)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,Past,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_006b3198;
  return;
}

Assistant:

PastFunc() : SystemSubroutine(KnownSystemName::Past, SubroutineKind::Function) {}